

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O3

void __thiscall
QCommandLineParserPrivate::showHelp
          (QCommandLineParserPrivate *this,int exitCode,bool includeQtOptions)

{
  QString QStack_28;
  
  helpText(&QStack_28,this,includeQtOptions);
  QCommandLineParser::showMessageAndExit(Information,&QStack_28,exitCode);
}

Assistant:

Q_NORETURN void QCommandLineParserPrivate::showHelp(int exitCode, bool includeQtOptions)
{
    QCommandLineParser::showMessageAndExit(QCommandLineParser::MessageType::Information,
                                           helpText(includeQtOptions),
                                           exitCode);
}